

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

void __thiscall addrman_tests::addrman_simple::addrman_simple(addrman_simple *this)

{
  long lVar1;
  long in_FS_OFFSET;
  TestOpts *in_stack_00000130;
  ChainType in_stack_0000013c;
  BasicTestingSetup *in_stack_00000140;
  TestOpts *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&in_stack_ffffffffffffffa8->extra_args);
  BasicTestingSetup::BasicTestingSetup(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
  TestOpts::~TestOpts(in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_simple)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    CNetAddr source = ResolveIP("252.2.2.2");

    // Test: Does Addrman respond correctly when empty.
    BOOST_CHECK_EQUAL(addrman->Size(), 0U);
    auto addr_null = addrman->Select().first;
    BOOST_CHECK_EQUAL(addr_null.ToStringAddrPort(), "[::]:0");

    // Test: Does Addrman::Add work as expected.
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);
    auto addr_ret1 = addrman->Select().first;
    BOOST_CHECK_EQUAL(addr_ret1.ToStringAddrPort(), "250.1.1.1:8333");

    // Test: Does IP address deduplication work correctly.
    //  Expected dup IP should not be added.
    CService addr1_dup = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(!addrman->Add({CAddress(addr1_dup, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);


    // Test: New table has one addr and we add a diff addr we should
    //  have at least one addr.
    // Note that addrman's size cannot be tested reliably after insertion, as
    // hash collisions may occur. But we can always be sure of at least one
    // success.

    CService addr2 = ResolveService("250.1.1.2", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr2, NODE_NONE)}, source));
    BOOST_CHECK(addrman->Size() >= 1);

    // Test: reset addrman and test AddrMan::Add multiple addresses works as expected
    addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    std::vector<CAddress> vAddr;
    vAddr.emplace_back(ResolveService("250.1.1.3", 8333), NODE_NONE);
    vAddr.emplace_back(ResolveService("250.1.1.4", 8333), NODE_NONE);
    BOOST_CHECK(addrman->Add(vAddr, source));
    BOOST_CHECK(addrman->Size() >= 1);
}